

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvDirectDemo_ls.c
# Opt level: O0

int Problem2(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  SUNNonlinearSolver *NLS_00;
  sunrealtype sVar4;
  void *pvVar5;
  SUNContext sunctx;
  sunrealtype hu;
  int iout;
  int qu;
  int firstrun;
  void *cvode_mem;
  SUNNonlinearSolver NLS;
  SUNLinearSolver LS;
  SUNMatrix A;
  N_Vector y;
  int nerr;
  int temp_retval;
  int retval;
  int miter;
  sunrealtype ero;
  sunrealtype erm;
  sunrealtype er;
  sunrealtype tout;
  sunrealtype t;
  sunrealtype abstol;
  sunrealtype reltol;
  sunrealtype in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  SUNMatrix *in_stack_ffffffffffffff58;
  N_Vector p_Var6;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  void *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined1 local_80 [4];
  uint local_7c;
  undefined8 local_78;
  void *pvVar7;
  N_Vector_Ops p_Var8;
  SUNContext pSVar9;
  int iVar10;
  undefined4 in_stack_ffffffffffffffb4;
  void *pvVar11;
  double local_28;
  undefined1 local_20 [8];
  double local_18;
  undefined8 local_10;
  int local_4;
  
  local_10 = 0;
  local_18 = 1e-06;
  iVar10 = 0;
  pSVar9 = (SUNContext)0x0;
  p_Var8 = (N_Vector_Ops)0x0;
  pvVar7 = (void *)0x0;
  local_78 = 0;
  SUNContext_Create(0,&stack0xffffffffffffff68);
  iVar1 = check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                       (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
  if (iVar1 == 0) {
    NLS_00 = (SUNNonlinearSolver *)
             N_VNew_Serial(0x19,CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    iVar1 = check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                         (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
    if (iVar1 == 0) {
      PrintIntro2();
      local_78 = CVodeCreate(1,CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      iVar1 = check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                           (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
      if (iVar1 == 0) {
        for (iVar1 = 0; iVar3 = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20), iVar1 < 6;
            iVar1 = iVar1 + 1) {
          if ((iVar1 != 1) && (iVar1 != 2)) {
            pvVar11 = (void *)0x0;
            N_VConst(0,NLS_00);
            (*NLS_00)->sunctx->profiler = (SUNProfiler)0x3ff0000000000000;
            local_7c = (uint)(iVar1 == 0);
            if (local_7c == 0) {
              CVodeReInit(0,local_78,NLS_00);
              iVar3 = check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,iVar3);
              if (iVar3 != 0) {
                return 1;
              }
            }
            else {
              CVodeInit(0,local_78,f2,NLS_00);
              iVar2 = check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,iVar3);
              if (iVar2 != 0) {
                return 1;
              }
              CVodeSStolerances(local_10,local_18,local_78);
              iVar3 = check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,iVar3);
              if (iVar3 != 0) {
                return 1;
              }
            }
            in_stack_ffffffffffffff58 = (SUNMatrix *)&stack0xffffffffffffff98;
            p_Var6 = (N_Vector)&stack0xffffffffffffff90;
            in_stack_ffffffffffffff48 = 0.0;
            in_stack_ffffffffffffff50 = (char *)0x5;
            PrepareNextRun((SUNContext)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
                           ,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                           in_stack_ffffffffffffff68,p_Var6,in_stack_ffffffffffffff58,
                           (sunindextype)pvVar7,(sunindextype)p_Var8,(SUNLinearSolver *)pSVar9,
                           NLS_00);
            iVar3 = check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                                 (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
            if (iVar3 != 0) {
              return 1;
            }
            PrintHeader2();
            local_28 = 0.01;
            for (in_stack_ffffffffffffff7c = 1; in_stack_ffffffffffffff7c < 6;
                in_stack_ffffffffffffff7c = in_stack_ffffffffffffff7c + 1) {
              iVar3 = CVode(local_28,local_78,NLS_00,local_20,1);
              check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                           (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
              sVar4 = MaxError((N_Vector)p_Var8,(sunrealtype)pvVar7);
              CVodeGetLastOrder(local_78,local_80);
              iVar2 = check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                                   (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
              if (iVar2 != 0) {
                iVar10 = iVar10 + 1;
              }
              in_stack_ffffffffffffffb4 = CVodeGetLastStep(local_78,&stack0xffffffffffffff70);
              iVar2 = check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                                   (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
              if (iVar2 != 0) {
                iVar10 = iVar10 + 1;
              }
              PrintOutput2((sunrealtype)p_Var6,(sunrealtype)in_stack_ffffffffffffff58,
                           (int)((ulong)in_stack_ffffffffffffff50 >> 0x20),in_stack_ffffffffffffff48
                          );
              if (iVar3 != 0) {
                iVar10 = iVar10 + 1;
                break;
              }
              pvVar5 = (void *)(sVar4 / local_18);
              if ((double)pvVar11 < (double)pvVar5) {
                pvVar11 = pvVar5;
              }
              if (1000.0 < (double)pvVar5) {
                iVar10 = iVar10 + 1;
                PrintErrOutput(5.24370150360211e-318);
              }
              local_28 = local_28 * 10.0;
            }
            PrintFinalStats(pvVar11,iVar1,(sunrealtype)CONCAT44(in_stack_ffffffffffffffb4,iVar10));
          }
        }
        CVodeFree(&local_78);
        SUNNonlinSolFree(pvVar7);
        SUNLinSolFree(p_Var8);
        SUNMatDestroy(pSVar9);
        pvVar7 = (void *)0x0;
        p_Var8 = (N_Vector_Ops)0x0;
        pSVar9 = (SUNContext)0x0;
        local_78 = CVodeCreate(2,CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        iVar1 = check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                             (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
        if (iVar1 == 0) {
          for (iVar1 = 0; iVar3 = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20), iVar1 < 6;
              iVar1 = iVar1 + 1) {
            if ((iVar1 != 1) && (iVar1 != 2)) {
              pvVar11 = (void *)0x0;
              N_VConst(0,NLS_00);
              (*NLS_00)->sunctx->profiler = (SUNProfiler)0x3ff0000000000000;
              local_7c = (uint)(iVar1 == 0);
              if (local_7c == 0) {
                CVodeReInit(0,local_78,NLS_00);
                iVar3 = check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,iVar3);
                if (iVar3 != 0) {
                  return 1;
                }
              }
              else {
                CVodeInit(0,local_78,f2,NLS_00);
                iVar2 = check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,iVar3);
                if (iVar2 != 0) {
                  return 1;
                }
                CVodeSStolerances(local_10,local_18,local_78);
                iVar3 = check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,iVar3);
                if (iVar3 != 0) {
                  return 1;
                }
              }
              in_stack_ffffffffffffff58 = (SUNMatrix *)&stack0xffffffffffffff98;
              p_Var6 = (N_Vector)&stack0xffffffffffffff90;
              in_stack_ffffffffffffff48 = 0.0;
              in_stack_ffffffffffffff50 = (char *)0x5;
              PrepareNextRun((SUNContext)
                             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                             in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                             in_stack_ffffffffffffff68,p_Var6,in_stack_ffffffffffffff58,
                             (sunindextype)pvVar7,(sunindextype)p_Var8,(SUNLinearSolver *)pSVar9,
                             NLS_00);
              iVar3 = check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                                   (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
              if (iVar3 != 0) {
                return 1;
              }
              PrintHeader2();
              local_28 = 0.01;
              for (in_stack_ffffffffffffff7c = 1; in_stack_ffffffffffffff7c < 6;
                  in_stack_ffffffffffffff7c = in_stack_ffffffffffffff7c + 1) {
                iVar3 = CVode(local_28,local_78,NLS_00,local_20,1);
                check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                             (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
                sVar4 = MaxError((N_Vector)p_Var8,(sunrealtype)pvVar7);
                CVodeGetLastOrder(local_78,local_80);
                iVar2 = check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                                     (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
                if (iVar2 != 0) {
                  iVar10 = iVar10 + 1;
                }
                in_stack_ffffffffffffffb4 = CVodeGetLastStep(local_78,&stack0xffffffffffffff70);
                iVar2 = check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                                     (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
                if (iVar2 != 0) {
                  iVar10 = iVar10 + 1;
                }
                PrintOutput2((sunrealtype)p_Var6,(sunrealtype)in_stack_ffffffffffffff58,
                             (int)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                             in_stack_ffffffffffffff48);
                if (iVar3 != 0) {
                  iVar10 = iVar10 + 1;
                  break;
                }
                pvVar5 = (void *)(sVar4 / local_18);
                if ((double)pvVar11 < (double)pvVar5) {
                  pvVar11 = pvVar5;
                }
                if (1000.0 < (double)pvVar5) {
                  iVar10 = iVar10 + 1;
                  PrintErrOutput(5.2489534214174e-318);
                }
                local_28 = local_28 * 10.0;
              }
              PrintFinalStats(pvVar11,iVar1,(sunrealtype)CONCAT44(in_stack_ffffffffffffffb4,iVar10))
              ;
            }
          }
          CVodeFree(&local_78);
          SUNNonlinSolFree(pvVar7);
          SUNLinSolFree(p_Var8);
          SUNMatDestroy(pSVar9);
          N_VDestroy(NLS_00);
          SUNContext_Free(&stack0xffffffffffffff68);
          local_4 = iVar10;
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int Problem2(void)
{
  sunrealtype reltol = RTOL, abstol = ATOL, t, tout, er, erm, ero;
  int miter, retval, temp_retval, nerr = 0;
  N_Vector y;
  SUNMatrix A;
  SUNLinearSolver LS;
  SUNNonlinearSolver NLS;
  void* cvode_mem;
  sunbooleantype firstrun;
  int qu, iout;
  sunrealtype hu;
  SUNContext sunctx;

  y         = NULL;
  A         = NULL;
  LS        = NULL;
  NLS       = NULL;
  cvode_mem = NULL;

  /* Create SUNDIALS context */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  y = N_VNew_Serial(P2_NEQ, sunctx);
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return (1); }

  PrintIntro2();

  cvode_mem = CVodeCreate(CV_ADAMS, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  for (miter = FUNC; miter <= BAND_DQ; miter++)
  {
    if ((miter == DENSE_USER) || (miter == DENSE_DQ)) { continue; }
    ero = ZERO;
    N_VConst(ZERO, y);
    NV_Ith_S(y, 0) = ONE;

    firstrun = (miter == FUNC);
    if (firstrun)
    {
      /* initialize CVode */
      retval = CVodeInit(cvode_mem, f2, P2_T0, y);
      if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

      /* set scalar tolerances */
      retval = CVodeSStolerances(cvode_mem, reltol, abstol);
      if (check_retval(&retval, "CVodeSStolerances", 1)) { return (1); }
    }
    else
    {
      /* reinitialize CVode */
      retval = CVodeReInit(cvode_mem, P2_T0, y);
      if (check_retval(&retval, "CVodeReInit", 1)) { return (1); }
    }

    retval = PrepareNextRun(sunctx, cvode_mem, CV_ADAMS, miter, y, &A, P2_MU,
                            P2_ML, &LS, &NLS);
    if (check_retval(&retval, "PrepareNextRun", 1)) { return (1); }

    PrintHeader2();

    for (iout = 1, tout = P2_T1; iout <= P2_NOUT; iout++, tout *= P2_TOUT_MULT)
    {
      retval = CVode(cvode_mem, tout, y, &t, CV_NORMAL);
      check_retval(&retval, "CVode", 1);
      erm         = MaxError(y, t);
      temp_retval = CVodeGetLastOrder(cvode_mem, &qu);
      if (check_retval(&temp_retval, "CVodeGetLastOrder", 1)) { ++nerr; }
      temp_retval = CVodeGetLastStep(cvode_mem, &hu);
      if (check_retval(&temp_retval, "CVodeGetLastStep", 1)) { ++nerr; }
      PrintOutput2(t, erm, qu, hu);
      if (retval != CV_SUCCESS)
      {
        nerr++;
        break;
      }
      er = erm / abstol;
      if (er > ero) { ero = er; }
      if (er > P2_TOL_FACTOR)
      {
        nerr++;
        PrintErrOutput(P2_TOL_FACTOR);
      }
    }

    PrintFinalStats(cvode_mem, miter, ero);
  }

  CVodeFree(&cvode_mem);
  SUNNonlinSolFree(NLS);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);
  NLS = NULL;
  LS  = NULL;
  A   = NULL;

  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  for (miter = FUNC; miter <= BAND_DQ; miter++)
  {
    if ((miter == DENSE_USER) || (miter == DENSE_DQ)) { continue; }
    ero = ZERO;
    N_VConst(ZERO, y);
    NV_Ith_S(y, 0) = ONE;

    firstrun = (miter == FUNC);
    if (firstrun)
    {
      /* initialize CVode */
      retval = CVodeInit(cvode_mem, f2, P2_T0, y);
      if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

      /* set scalar tolerances */
      retval = CVodeSStolerances(cvode_mem, reltol, abstol);
      if (check_retval(&retval, "CVodeSStolerances", 1)) { return (1); }
    }
    else
    {
      /* reinitialize CVode */
      retval = CVodeReInit(cvode_mem, P2_T0, y);
      if (check_retval(&retval, "CVodeReInit", 1)) { return (1); }
    }

    retval = PrepareNextRun(sunctx, cvode_mem, CV_BDF, miter, y, &A, P2_MU,
                            P2_ML, &LS, &NLS);
    if (check_retval(&retval, "PrepareNextRun", 1)) { return (1); }

    PrintHeader2();

    for (iout = 1, tout = P2_T1; iout <= P2_NOUT; iout++, tout *= P2_TOUT_MULT)
    {
      retval = CVode(cvode_mem, tout, y, &t, CV_NORMAL);
      check_retval(&retval, "CVode", 1);
      erm         = MaxError(y, t);
      temp_retval = CVodeGetLastOrder(cvode_mem, &qu);
      if (check_retval(&temp_retval, "CVodeGetLastOrder", 1)) { ++nerr; }
      temp_retval = CVodeGetLastStep(cvode_mem, &hu);
      if (check_retval(&temp_retval, "CVodeGetLastStep", 1)) { ++nerr; }
      PrintOutput2(t, erm, qu, hu);
      if (retval != CV_SUCCESS)
      {
        nerr++;
        break;
      }
      er = erm / abstol;
      if (er > ero) { ero = er; }
      if (er > P2_TOL_FACTOR)
      {
        nerr++;
        PrintErrOutput(P2_TOL_FACTOR);
      }
    }

    PrintFinalStats(cvode_mem, miter, ero);
  }

  CVodeFree(&cvode_mem);
  SUNNonlinSolFree(NLS);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);
  N_VDestroy(y);
  SUNContext_Free(&sunctx);

  return (nerr);
}